

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TextureSwizzle::FunctionalTest::fillMSTexture
          (FunctionalTest *this,size_t format_idx,size_t target_idx)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar6;
  undefined1 local_60 [8];
  programInfo program;
  GLenum status;
  Functions *gl;
  GLenum target;
  size_t target_idx_local;
  size_t format_idx_local;
  FunctionalTest *this_local;
  long lVar5;
  
  iVar1 = *(int *)(texture_targets + target_idx * 0x30 + 0x28);
  pRVar4 = deqp::Context::getRenderContext((this->super_SmokeTest).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x78))(0x8d40,(this->super_SmokeTest).m_prepare_fbo_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xf6b);
  if (iVar1 == 0x9100) {
    (**(code **)(lVar5 + 0x6a0))(0x8d40,0x8ce0,0x9100,(this->super_SmokeTest).m_source_tex_id,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"FramebufferTexture2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xf73);
  }
  else {
    if (iVar1 != 0x9102) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xf7f);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar5 + 0x6b8))(0x8d40,0x8ce0,(this->super_SmokeTest).m_source_tex_id,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"FramebufferTexture2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xf7a);
  }
  program.m_vertex_shader_id = (**(code **)(lVar5 + 0x170))(0x8d40);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"CheckFramebufferStatus",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xf85);
  if (program.m_vertex_shader_id == 0x8cdd) {
    (**(code **)(lVar5 + 0x78))(0x8d40,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"BindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xf8b);
    this_local._7_1_ = false;
  }
  else {
    if (program.m_vertex_shader_id != 0x8cd5) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Framebuffer is incomplete. Format is supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xf91);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar5 + 0x1a00))(0,0,8);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xf96);
    Utils::programInfo::programInfo
              ((programInfo *)local_60,(this->super_SmokeTest).super_TestCase.m_context);
    prepareProgram(this,format_idx,(programInfo *)local_60);
    (**(code **)(lVar5 + 0x1680))(program.m_context._4_4_);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xf9c);
    (**(code **)(lVar5 + 0x188))(0x4000);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,4000);
    (**(code **)(lVar5 + 0x538))(5,0,4);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"DrawArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xfa4);
    (**(code **)(lVar5 + 0x78))(0x8d40,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"BindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xfa8);
    this_local._7_1_ = true;
    Utils::programInfo::~programInfo((programInfo *)local_60);
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionalTest::fillMSTexture(size_t format_idx, size_t target_idx)
{
	const glw::GLenum target = texture_targets[target_idx].m_target;

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind FBO */
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_prepare_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

	/* Attach texture */
	switch (target)
	{
	case GL_TEXTURE_2D_MULTISAMPLE:

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, target, m_source_tex_id, 0 /* level */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

		break;

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:

		gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_source_tex_id, 0 /* level */, 0 /* layer */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Verify status */
	const glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CheckFramebufferStatus");

	if (GL_FRAMEBUFFER_UNSUPPORTED == status)
	{
		/* Unbind */
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

		return false;
	}
	else if (GL_FRAMEBUFFER_COMPLETE != status)
	{
		TCU_FAIL("Framebuffer is incomplete. Format is supported");
	}

	/* Set Viewport */
	gl.viewport(0 /* x */, 0 /* y */, m_output_width, m_output_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

	Utils::programInfo program(m_context);
	prepareProgram(format_idx, program);

	gl.useProgram(program.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Clear */
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");

	/* Draw */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Unbind FBO */
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

	/* Done */
	return true;
}